

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KInstPrinter.c
# Opt level: O0

void M68K_printInst(MCInst *MI,SStream *O,void *PrinterInfo)

{
  int iVar1;
  void *__dest;
  long in_RDX;
  SStream *in_RSI;
  long in_RDI;
  int reg_value_1;
  int reg_value_0;
  int groups_count;
  int regs_write_count;
  int regs_read_count;
  int i;
  cs_detail *detail;
  cs_m68k *ext;
  m68k_info *info;
  char *in_stack_ffffffffffffff98;
  SStream *in_stack_ffffffffffffffa0;
  uint local_54;
  uint local_50;
  uint local_4c;
  int local_34;
  
  __dest = *(void **)(*(long *)(in_RDI + 0x310) + 0xf0);
  if (__dest != (void *)0x0) {
    if (*(byte *)(in_RDX + 0x148) < 0x11) {
      local_4c = (uint)*(byte *)(in_RDX + 0x148);
    }
    else {
      local_4c = 0x10;
    }
    if (*(byte *)(in_RDX + 0x172) < 0x15) {
      local_50 = (uint)*(byte *)(in_RDX + 0x172);
    }
    else {
      local_50 = 0x14;
    }
    if (*(byte *)(in_RDX + 0x17b) < 9) {
      local_54 = (uint)*(byte *)(in_RDX + 0x17b);
    }
    else {
      local_54 = 8;
    }
    memcpy((void *)((long)__dest + 0x58),(undefined8 *)(in_RDX + 0x30),0xf0);
    memcpy(__dest,(void *)(in_RDX + 0x120),(long)(int)local_4c << 1);
    *(char *)((long)__dest + 0x20) = (char)local_4c;
    memcpy((void *)((long)__dest + 0x22),(void *)(in_RDX + 0x14a),(long)(int)local_50 << 1);
    *(char *)((long)__dest + 0x4a) = (char)local_50;
    memcpy((void *)((long)__dest + 0x4b),(void *)(in_RDX + 0x173),(long)(int)local_54);
    *(char *)((long)__dest + 0x53) = (char)local_54;
  }
  if (*(int *)(in_RDI + 8) == 0) {
    if (*(char *)(in_RDX + 0x118) == '\0') {
      SStream_concat(in_RSI,"dc.w $<unknown>");
    }
    else {
      SStream_concat(in_RSI,"dc.w $%x",*(undefined8 *)(in_RDX + 0x30));
    }
  }
  else {
    SStream_concat0(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    iVar1 = *(int *)(in_RDX + 0x110);
    if (iVar1 != 0) {
      if (iVar1 == 1) {
        in_stack_ffffffffffffffa0 = (SStream *)(ulong)*(uint *)(in_RDX + 0x114);
        switch(in_stack_ffffffffffffffa0) {
        case (SStream *)0x0:
          break;
        case (SStream *)0x1:
          SStream_concat0(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          break;
        case (SStream *)0x2:
          SStream_concat0(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          break;
        case (SStream *)0x4:
          SStream_concat0(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
      }
      else if (iVar1 == 2) {
        in_stack_ffffffffffffff98 = (char *)(ulong)*(uint *)(in_RDX + 0x114);
        switch(in_stack_ffffffffffffff98) {
        case (char *)0x0:
          break;
        case (char *)0x4:
          SStream_concat0(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          break;
        case (char *)0x8:
          SStream_concat0(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          break;
        case (char *)0xc:
          SStream_concat0(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        }
      }
    }
    SStream_concat0(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (*(int *)(in_RDI + 8) == 0x2c) {
      printAddressingMode((SStream *)ext,detail._4_4_,_regs_read_count,_groups_count);
      SStream_concat0(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      printAddressingMode((SStream *)ext,detail._4_4_,_regs_read_count,_groups_count);
      SStream_concat0(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      SStream_concat(in_RSI,"(%s):(%s)",s_reg_names[(int)((*(uint *)(in_RDX + 0xcc) >> 4) + 1)],
                     s_reg_names[(int)((*(uint *)(in_RDX + 0xcc) & 0xf) + 1)]);
    }
    else {
      for (local_34 = 0; local_34 < (int)(uint)*(byte *)(in_RDX + 0x118); local_34 = local_34 + 1) {
        printAddressingMode((SStream *)ext,detail._4_4_,_regs_read_count,_groups_count);
        if (local_34 + 1U != (uint)*(byte *)(in_RDX + 0x118)) {
          SStream_concat(in_RSI,",%s",s_spacing);
        }
      }
    }
  }
  return;
}

Assistant:

void M68K_printInst(MCInst* MI, SStream* O, void* PrinterInfo)
{
#ifndef CAPSTONE_DIET
	m68k_info *info = (m68k_info *)PrinterInfo;
	cs_m68k *ext = &info->extension;
	cs_detail *detail = NULL;
	int i = 0;

	detail = MI->flat_insn->detail;
	if (detail) {
		int regs_read_count = m68k_min(m68k_sizeof_array(detail->regs_read), info->regs_read_count);
		int regs_write_count = m68k_min(m68k_sizeof_array(detail->regs_write), info->regs_write_count);
		int groups_count = m68k_min(m68k_sizeof_array(detail->groups), info->groups_count);

		memcpy(&detail->m68k, ext, sizeof(cs_m68k));

		memcpy(&detail->regs_read, &info->regs_read, regs_read_count * sizeof(uint16_t));
		detail->regs_read_count = regs_read_count;

		memcpy(&detail->regs_write, &info->regs_write, regs_write_count * sizeof(uint16_t));
		detail->regs_write_count = regs_write_count;

		memcpy(&detail->groups, &info->groups, groups_count);
		detail->groups_count = groups_count;
	}

	if (MI->Opcode == M68K_INS_INVALID) {
		if (ext->op_count)
			SStream_concat(O, "dc.w $%x", ext->operands[0].imm);
		else
			SStream_concat(O, "dc.w $<unknown>");
		return;
	}

	SStream_concat0(O, (char*)s_instruction_names[MI->Opcode]);

	switch (ext->op_size.type) {
		case M68K_SIZE_TYPE_INVALID :
			break;

		case M68K_SIZE_TYPE_CPU :
			switch (ext->op_size.cpu_size) {
				case M68K_CPU_SIZE_BYTE: SStream_concat0(O, ".b"); break;
				case M68K_CPU_SIZE_WORD: SStream_concat0(O, ".w"); break;
				case M68K_CPU_SIZE_LONG: SStream_concat0(O, ".l"); break;
				case M68K_CPU_SIZE_NONE: break;
			}
			break;

		case M68K_SIZE_TYPE_FPU :
			switch (ext->op_size.fpu_size) {
				case M68K_FPU_SIZE_SINGLE: SStream_concat0(O, ".s"); break;
				case M68K_FPU_SIZE_DOUBLE: SStream_concat0(O, ".d"); break;
				case M68K_FPU_SIZE_EXTENDED: SStream_concat0(O, ".x"); break;
				case M68K_FPU_SIZE_NONE: break;
			}
			break;
	}

	SStream_concat0(O, " ");

	// this one is a bit spacial so we do special things

	if (MI->Opcode == M68K_INS_CAS2) {
		int reg_value_0, reg_value_1;
		printAddressingMode(O, info->pc, ext, &ext->operands[0]); SStream_concat0(O, ",");
		printAddressingMode(O, info->pc, ext, &ext->operands[1]); SStream_concat0(O, ",");
		reg_value_0 = ext->operands[2].register_bits >> 4;
		reg_value_1 = ext->operands[2].register_bits & 0xf;
		SStream_concat(O, "(%s):(%s)", s_reg_names[M68K_REG_D0 + reg_value_0], s_reg_names[M68K_REG_D0 + reg_value_1]);
		return;
	}

	for (i  = 0; i < ext->op_count; ++i) {
		printAddressingMode(O, info->pc, ext, &ext->operands[i]);
		if ((i + 1) != ext->op_count)
			SStream_concat(O, ",%s", s_spacing);
	}
#endif
}